

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddChild<std::__cxx11::string>
          (Node *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  Node c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  string *name_local;
  Node *this_local;
  
  c.property_start = (size_t)more;
  Node((Node *)local_90,name);
  std::__cxx11::string::string((string *)&local_b0,(string *)more);
  AddProperties<std::__cxx11::string>((Node *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }